

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bruteforce.hpp
# Opt level: O2

PointSet * __thiscall
hnsw::BruteForceIndex::Search
          (PointSet *__return_storage_ptr__,BruteForceIndex *this,uint32_t K,float *query)

{
  float fVar1;
  float dist;
  MaxPointHeap result;
  uint local_60;
  float local_5c;
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  local_58;
  
  fVar1 = 0.0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_58.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  for (local_60 = 0; local_60 < this->num_points_; local_60 = local_60 + 1) {
    (**this->distance_->_vptr_Distance)
              (this->distance_,query,
               (this->points_).row_ptrs_.
               super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_60]);
    local_5c = fVar1;
    std::
    priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
    ::emplace<unsigned_int&,float&>
              ((priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
                *)&local_58,&local_60,&local_5c);
    if ((ulong)K <
        (ulong)(CONCAT44(local_58.c.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         local_58.c.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                CONCAT44(local_58.c.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_58.c.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3)) {
      std::
      priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
      ::pop(&local_58);
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while ((value_type *)
         CONCAT44(local_58.c.
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                  local_58.c.
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_) !=
         (value_type *)
         CONCAT44(local_58.c.
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                  local_58.c.
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_4_)) {
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    push_back(__return_storage_ptr__,
              (value_type *)
              CONCAT44(local_58.c.
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_58.c.
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    std::
    priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
    ::pop(&local_58);
  }
  std::
  _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  ~_Vector_base((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

PointSet Search(uint32_t K, const float *query) {
    MaxPointHeap result;
    for (uint32_t i = 0; i < num_points_; i++) {
      float dist = distance_(query, points_[i]);
      result.emplace(i, dist);
      if (result.size() > K) {
        result.pop();
      }
    }

    PointSet neighbors;
    while (!result.empty()) {
      neighbors.push_back(result.top());
      result.pop();
    }
    return neighbors;
  }